

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcUif.c
# Opt level: O0

int Wlc_NtkPairIsUifable(Wlc_Ntk_t *p,Wlc_Obj_t *pObj,Wlc_Obj_t *pObj2)

{
  int iVar1;
  int iVar2;
  Wlc_Obj_t *p_00;
  Wlc_Obj_t *p_01;
  int local_3c;
  int k;
  Wlc_Obj_t *pFanin2;
  Wlc_Obj_t *pFanin;
  Wlc_Obj_t *pObj2_local;
  Wlc_Obj_t *pObj_local;
  Wlc_Ntk_t *p_local;
  
  iVar1 = Wlc_ObjRange(pObj);
  iVar2 = Wlc_ObjRange(pObj2);
  if (iVar1 == iVar2) {
    iVar1 = Wlc_ObjIsSigned(pObj);
    iVar2 = Wlc_ObjIsSigned(pObj2);
    if (iVar1 == iVar2) {
      iVar1 = Wlc_ObjFaninNum(pObj);
      iVar2 = Wlc_ObjFaninNum(pObj2);
      if (iVar1 == iVar2) {
        for (local_3c = 0; iVar1 = Wlc_ObjFaninNum(pObj), local_3c < iVar1; local_3c = local_3c + 1)
        {
          p_00 = Wlc_ObjFanin(p,pObj,local_3c);
          p_01 = Wlc_ObjFanin(p,pObj2,local_3c);
          iVar1 = Wlc_ObjRange(p_00);
          iVar2 = Wlc_ObjRange(p_01);
          if (iVar1 != iVar2) {
            return 0;
          }
          iVar1 = Wlc_ObjIsSigned(p_00);
          iVar2 = Wlc_ObjIsSigned(p_01);
          if (iVar1 != iVar2) {
            return 0;
          }
        }
        p_local._4_4_ = 1;
      }
      else {
        p_local._4_4_ = 0;
      }
    }
    else {
      p_local._4_4_ = 0;
    }
  }
  else {
    p_local._4_4_ = 0;
  }
  return p_local._4_4_;
}

Assistant:

int Wlc_NtkPairIsUifable( Wlc_Ntk_t * p, Wlc_Obj_t * pObj, Wlc_Obj_t * pObj2 )
{
    Wlc_Obj_t * pFanin, * pFanin2;  int k;
    if ( Wlc_ObjRange(pObj) != Wlc_ObjRange(pObj2) )
        return 0;
    if ( Wlc_ObjIsSigned(pObj) != Wlc_ObjIsSigned(pObj2) )
        return 0;
    if ( Wlc_ObjFaninNum(pObj) != Wlc_ObjFaninNum(pObj2) )
        return 0;
    for ( k = 0; k < Wlc_ObjFaninNum(pObj); k++ )
    {
        pFanin = Wlc_ObjFanin(p, pObj, k);
        pFanin2 = Wlc_ObjFanin(p, pObj2, k);
        if ( Wlc_ObjRange(pFanin) != Wlc_ObjRange(pFanin2) )
            return 0;
        if ( Wlc_ObjIsSigned(pFanin) != Wlc_ObjIsSigned(pFanin2) )
            return 0;
    }
    return 1;
}